

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O3

set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
* __thiscall
dgrminer::PartialUnion::compute_labeled_nodes
          (set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
           *__return_storage_ptr__,PartialUnion *this)

{
  _Rb_tree_header *p_Var1;
  pointer paVar2;
  long lVar3;
  ulong uVar4;
  labeled_node_time lnt;
  labeled_node_time local_40;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar2 = (this->nodes).
           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->nodes).super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != paVar2) {
    lVar3 = 0x10;
    uVar4 = 0;
    do {
      local_40.time = *(int *)((long)paVar2->_M_elems + lVar3 + -0x10);
      local_40.id = *(int *)((long)paVar2->_M_elems + lVar3 + -0xc);
      local_40.label = *(int *)((long)paVar2->_M_elems + lVar3 + -8);
      local_40.changetime = *(int *)((long)paVar2->_M_elems + lVar3);
      std::
      _Rb_tree<dgrminer::labeled_node_time,dgrminer::labeled_node_time,std::_Identity<dgrminer::labeled_node_time>,std::less<dgrminer::labeled_node_time>,std::allocator<dgrminer::labeled_node_time>>
      ::_M_insert_unique<dgrminer::labeled_node_time_const&>
                ((_Rb_tree<dgrminer::labeled_node_time,dgrminer::labeled_node_time,std::_Identity<dgrminer::labeled_node_time>,std::less<dgrminer::labeled_node_time>,std::allocator<dgrminer::labeled_node_time>>
                  *)__return_storage_ptr__,&local_40);
      uVar4 = uVar4 + 1;
      paVar2 = (this->nodes).
               super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x18;
    } while (uVar4 < (ulong)(((long)(this->nodes).
                                    super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)paVar2 >> 3)
                            * -0x5555555555555555));
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<labeled_node_time> PartialUnion::compute_labeled_nodes()
	{
		std::set<labeled_node_time> labeled_nodes;
		for (size_t i = 0; i < nodes.size(); i++)
		{
			labeled_node_time lnt;
			lnt.time = nodes[i][PN_TIME];
			lnt.id = nodes[i][PN_ID];
			lnt.label = nodes[i][PN_LABEL];
			lnt.changetime = nodes[i][PN_CHANGETIME];
			labeled_nodes.insert(lnt);
		}
		return labeled_nodes;
	}